

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O2

int dup_bn_into(BIGNUM **out,BIGNUM *src)

{
  tuple<bignum_st_*,_bssl::internal::Deleter> tVar1;
  pointer __p;
  UniquePtr<BIGNUM> a;
  
  tVar1.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>)BN_dup((BIGNUM *)src);
  if (tVar1.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         tVar1.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
    BN_free((BIGNUM *)*out);
    *out = (BIGNUM *)
           tVar1.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
  }
  a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a);
  return (uint)(tVar1.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_bignum_st_*,_false>)0x0);
}

Assistant:

static int dup_bn_into(BIGNUM **out, BIGNUM *src) {
  bssl::UniquePtr<BIGNUM> a(BN_dup(src));
  if (a == nullptr) {
    return 0;
  }
  BN_free(*out);
  *out = a.release();
  return 1;
}